

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_newproxy(lua_State *L)

{
  int iVar1;
  lua_State *in_RDI;
  int validproxy;
  lua_State *unaff_retaddr;
  lua_State *in_stack_00000010;
  char *in_stack_00000058;
  int in_stack_00000064;
  lua_State *in_stack_00000068;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int iVar2;
  int in_stack_fffffffffffffffc;
  
  lua_settop(in_RDI,1);
  lua_newuserdata(in_stack_00000010,(size_t)L);
  iVar1 = lua_toboolean(unaff_retaddr,in_stack_fffffffffffffffc);
  if (iVar1 != 0) {
    iVar1 = lua_type(unaff_retaddr,in_stack_fffffffffffffffc);
    if (iVar1 == 1) {
      lua_createtable(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
      lua_pushvalue(unaff_retaddr,in_stack_fffffffffffffffc);
      lua_pushboolean(in_RDI,1);
      lua_rawset(unaff_retaddr,in_stack_fffffffffffffffc);
    }
    else {
      iVar2 = 0;
      iVar1 = lua_getmetatable(in_stack_00000010,L._4_4_);
      if (iVar1 != 0) {
        lua_rawget(unaff_retaddr,in_stack_fffffffffffffffc);
        iVar2 = lua_toboolean(unaff_retaddr,in_stack_fffffffffffffffc);
        lua_settop(in_RDI,-2);
      }
      if (iVar2 == 0) {
        luaL_argerror(in_stack_00000068,in_stack_00000064,in_stack_00000058);
      }
      lua_getmetatable(in_stack_00000010,L._4_4_);
    }
    lua_setmetatable(unaff_retaddr,in_stack_fffffffffffffffc);
  }
  return 1;
}

Assistant:

static int luaB_newproxy(lua_State*L){
lua_settop(L,1);
lua_newuserdata(L,0);
if(lua_toboolean(L,1)==0)
return 1;
else if(lua_isboolean(L,1)){
lua_newtable(L);
lua_pushvalue(L,-1);
lua_pushboolean(L,1);
lua_rawset(L,lua_upvalueindex(1));
}
else{
int validproxy=0;
if(lua_getmetatable(L,1)){
lua_rawget(L,lua_upvalueindex(1));
validproxy=lua_toboolean(L,-1);
lua_pop(L,1);
}
luaL_argcheck(L,validproxy,1,"boolean or proxy expected");
lua_getmetatable(L,1);
}
lua_setmetatable(L,2);
return 1;
}